

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
NativeEntryPointData::ClearTypeRefsAndGuards
          (NativeEntryPointData *this,ScriptContext *scriptContext)

{
  nullptr_t local_28;
  nullptr_t local_20;
  ScriptContext *local_18;
  ScriptContext *scriptContext_local;
  NativeEntryPointData *this_local;
  
  local_20 = (nullptr_t)0x0;
  local_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
            (&this->runtimeTypeRefs,&local_20);
  FreePropertyGuards(this);
  this->equivalentTypeCacheCount = 0;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::EquivalentTypeCache>::operator=(&this->equivalentTypeCaches,&local_28)
  ;
  UnregisterEquivalentTypeCaches(this,local_18);
  return;
}

Assistant:

void 
NativeEntryPointData::ClearTypeRefsAndGuards(ScriptContext * scriptContext)
{
    this->runtimeTypeRefs = nullptr;
    this->FreePropertyGuards();
    this->equivalentTypeCacheCount = 0;
    this->equivalentTypeCaches = nullptr;
    this->UnregisterEquivalentTypeCaches(scriptContext);
}